

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O2

int evp_keyex_init(ptls_key_exchange_algorithm_t *algo,ptls_key_exchange_context_t **_ctx,
                  EVP_PKEY *pkey)

{
  st_evp_keyex_context_t *ctx;
  size_t sVar1;
  int iVar2;
  
  ctx = (st_evp_keyex_context_t *)malloc(0x28);
  iVar2 = 0x201;
  if (ctx != (st_evp_keyex_context_t *)0x0) {
    (ctx->super).algo = algo;
    (ctx->super).pubkey.base = (uint8_t *)0x0;
    (ctx->super).pubkey.len = 0;
    (ctx->super).on_exchange = evp_keyex_on_exchange;
    ctx->privkey = pkey;
    sVar1 = EVP_PKEY_get1_encoded_public_key(pkey,&(ctx->super).pubkey);
    (ctx->super).pubkey.len = sVar1;
    if (sVar1 == 0) {
      (ctx->super).pubkey.base = (uint8_t *)0x0;
      ctx->privkey = (EVP_PKEY *)0x0;
      evp_keyex_free(ctx);
    }
    else {
      *_ctx = (ptls_key_exchange_context_t *)ctx;
      iVar2 = 0;
    }
  }
  return iVar2;
}

Assistant:

static int evp_keyex_init(ptls_key_exchange_algorithm_t *algo, ptls_key_exchange_context_t **_ctx, EVP_PKEY *pkey)
{
    struct st_evp_keyex_context_t *ctx = NULL;
    int ret;

    /* instantiate */
    if ((ctx = malloc(sizeof(*ctx))) == NULL) {
        ret = PTLS_ERROR_NO_MEMORY;
        goto Exit;
    }
    *ctx = (struct st_evp_keyex_context_t){{algo, {NULL}, evp_keyex_on_exchange}, pkey};

    /* set public key */
    if ((ctx->super.pubkey.len = EVP_PKEY_get1_tls_encodedpoint(ctx->privkey, &ctx->super.pubkey.base)) == 0) {
        ctx->super.pubkey.base = NULL;
        ret = PTLS_ERROR_NO_MEMORY;
        goto Exit;
    }

    *_ctx = &ctx->super;
    ret = 0;
Exit:
    if (ret != 0 && ctx != NULL) {
        ctx->privkey = NULL; /* do not decrement refcount of pkey in case of error */
        evp_keyex_free(ctx);
    }
    return ret;
}